

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O3

char position_window(Fl_Window *w,char *prefsName,int Visible,int X,int Y,int W,int H)

{
  int defaultValue;
  char cVar1;
  Fl_Preferences pos;
  uint local_58;
  uint local_54;
  uint local_50;
  int local_4c;
  Fl_Preferences local_48;
  
  defaultValue = H;
  local_58 = Y;
  local_54 = X;
  local_50 = W;
  local_4c = Visible;
  Fl_Preferences::Fl_Preferences(&local_48,&fluid_prefs,prefsName);
  if ((prevpos_button->super_Fl_Light_Button).super_Fl_Button.value_ != '\0') {
    Fl_Preferences::get(&local_48,"x",(int *)&local_54,X);
    Fl_Preferences::get(&local_48,"y",(int *)&local_58,Y);
    if (W == 0) {
      (*(w->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[4])
                (w,(ulong)local_54,(ulong)local_58,
                 (ulong)(uint)(w->super_Fl_Group).super_Fl_Widget.w_,
                 (ulong)(uint)(w->super_Fl_Group).super_Fl_Widget.h_);
    }
    else {
      Fl_Preferences::get(&local_48,"w",(int *)&local_50,W);
      Fl_Preferences::get(&local_48,"h",&H,defaultValue);
      (*(w->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[4])
                (w,(ulong)local_54,(ulong)local_58,(ulong)local_50,(ulong)(uint)H);
    }
  }
  Fl_Preferences::get(&local_48,"visible",&local_4c,Visible);
  cVar1 = (char)local_4c;
  Fl_Plugin_Manager::~Fl_Plugin_Manager((Fl_Plugin_Manager *)&local_48);
  return cVar1;
}

Assistant:

char position_window(Fl_Window *w, const char *prefsName, int Visible, int X, int Y, int W=0, int H=0 ) {
  Fl_Preferences pos(fluid_prefs, prefsName);
  if (prevpos_button->value()) {
    pos.get("x", X, X);
    pos.get("y", Y, Y);
    if ( W!=0 ) {
      pos.get("w", W, W);
      pos.get("h", H, H);
      w->resize( X, Y, W, H );
    }
    else
      w->position( X, Y );
  }
  pos.get("visible", Visible, Visible);
  return Visible;
}